

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16663::FileSystemTest_testRecursiveRemovalDoesNotFollowSymlinks_Test::TestBody
          (FileSystemTest_testRecursiveRemovalDoesNotFollowSymlinks_Test *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  pointer pFVar6;
  int *rhs;
  __mode_t _Var7;
  char *in_R9;
  AssertHelper local_e40;
  Message local_e38;
  int local_e30 [2];
  undefined1 local_e28 [8];
  AssertionResult gtest_ar_5;
  Message local_e10;
  int local_e08 [2];
  undefined1 local_e00 [8];
  AssertionResult gtest_ar_4;
  Message local_de8;
  int local_ddc;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar_3;
  Message local_dc0;
  int local_db8 [2];
  undefined1 local_db0 [8];
  AssertionResult gtest_ar_2;
  StatStruct statbuf;
  AssertHelper local_cf0;
  Message local_ce8;
  undefined1 local_ce0 [8];
  AssertionResult gtest_ar__2;
  string local_cc8 [39];
  bool local_ca1;
  bool result;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> fs;
  Message local_c90;
  int local_c84;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar_1;
  Twine local_c58;
  Twine local_c40;
  Twine local_c28;
  StringRef local_c10;
  undefined1 local_c00 [8];
  SmallString<256U> directoryLinkPath;
  Message local_ae8;
  int local_adc;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar;
  undefined1 local_ac0 [4];
  int res;
  Twine local_aa8;
  Twine local_a90;
  Twine local_a78;
  StringRef local_a60;
  undefined1 local_a50 [8];
  SmallString<256U> linkPath;
  Twine local_928;
  Twine local_910;
  Twine local_8f8;
  string local_8e0;
  StringRef local_8c0;
  undefined1 local_8b0 [8];
  SmallString<256U> tempDir;
  AssertHelper local_780;
  Message local_778;
  bool local_769;
  undefined1 local_768 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_748 [8];
  raw_fd_ostream os_1;
  error_code ec_1;
  Twine local_6d0;
  Twine local_6b8;
  Twine local_6a0;
  StringRef local_688;
  undefined1 local_678 [8];
  SmallString<256U> otherFile;
  Twine local_550;
  Twine local_538;
  Twine local_520;
  string local_508;
  StringRef local_4e8;
  undefined1 local_4d8 [8];
  SmallString<256U> otherDir;
  AssertHelper local_3a8;
  Message local_3a0;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_;
  undefined1 local_370 [8];
  raw_fd_ostream os;
  error_code ec;
  Twine local_2f8;
  Twine local_2e0;
  Twine local_2c8;
  string local_2b0;
  StringRef local_290;
  undefined1 local_280 [8];
  SmallString<256U> file;
  undefined1 local_160 [8];
  TmpDir rootTempDir;
  FileSystemTest_testRecursiveRemovalDoesNotFollowSymlinks_Test *this_local;
  Twine *pTVar8;
  
  rootTempDir.tempDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
  _248_8_ = this;
  strlen("TestBody");
  llbuild::TmpDir::TmpDir((TmpDir *)local_160,stack0xfffffffffffffe90);
  llbuild::TmpDir::str_abi_cxx11_(&local_2b0,(TmpDir *)local_160);
  uVar3 = std::__cxx11::string::data();
  local_290.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_290.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_280,local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  llvm::Twine::Twine(&local_2c8,"test.txt");
  llvm::Twine::Twine(&local_2e0,"");
  llvm::Twine::Twine(&local_2f8,"");
  llvm::Twine::Twine((Twine *)&ec._M_cat,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_280,&local_2c8,&local_2e0,&local_2f8,(Twine *)&ec._M_cat
            );
  std::error_code::error_code((error_code *)&os.SupportsSeeking);
  join_0x00000010_0x00000000_ = llvm::SmallString<256U>::str((SmallString<256U> *)local_280);
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_370,join_0x00000010_0x00000000_,
             (error_code *)&os.SupportsSeeking,F_Text);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os.SupportsSeeking);
  local_391 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               (otherDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                InlineElts + 0xf8),(internal *)local_390,(AssertionResult *)0x27eef0,"true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x6f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string
              ((string *)
               (otherDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                InlineElts + 0xf8));
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  iVar2 = 0x27e85a;
  llvm::raw_ostream::operator<<((raw_ostream *)local_370,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)local_370,iVar2);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_370);
  llbuild::TmpDir::str_abi_cxx11_(&local_508,(TmpDir *)local_160);
  uVar3 = std::__cxx11::string::data();
  local_4e8.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_4e8.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_4d8,local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  llvm::Twine::Twine(&local_520,"other_dir");
  llvm::Twine::Twine(&local_538,"");
  llvm::Twine::Twine(&local_550,"");
  llvm::Twine::Twine((Twine *)(otherFile.super_SmallVector<char,_256U>.
                               super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),"");
  pTVar8 = &local_520;
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_4d8,pTVar8,&local_538,&local_550,
             (Twine *)(otherFile.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                       InlineElts + 0xf8));
  _Var7 = (__mode_t)pTVar8;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_4d8);
  llbuild::basic::sys::mkdir(pcVar4,_Var7);
  local_688 = llvm::SmallString<256U>::str((SmallString<256U> *)local_4d8);
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_678,local_688);
  llvm::Twine::Twine(&local_6a0,"test.txt");
  llvm::Twine::Twine(&local_6b8,"");
  llvm::Twine::Twine(&local_6d0,"");
  llvm::Twine::Twine((Twine *)&ec_1._M_cat,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_678,&local_6a0,&local_6b8,&local_6d0,
             (Twine *)&ec_1._M_cat);
  std::error_code::error_code((error_code *)&os_1.SupportsSeeking);
  join_0x00000010_0x00000000_ = llvm::SmallString<256U>::str((SmallString<256U> *)local_678);
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_748,join_0x00000010_0x00000000_,
             (error_code *)&os_1.SupportsSeeking,F_Text);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os_1.SupportsSeeking);
  local_769 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_768,&local_769,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar1) {
    testing::Message::Message(&local_778);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               (tempDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                InlineElts + 0xf8),(internal *)local_768,(AssertionResult *)0x27eef0,"true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_780,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x7d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_780,&local_778);
    testing::internal::AssertHelper::~AssertHelper(&local_780);
    std::__cxx11::string::~string
              ((string *)
               (tempDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                InlineElts + 0xf8));
    testing::Message::~Message(&local_778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  iVar2 = 0x27e85a;
  llvm::raw_ostream::operator<<((raw_ostream *)local_748,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)local_748,iVar2);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_748);
  llbuild::TmpDir::str_abi_cxx11_(&local_8e0,(TmpDir *)local_160);
  uVar3 = std::__cxx11::string::data();
  local_8c0.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_8c0.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_8b0,local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  llvm::Twine::Twine(&local_8f8,"root");
  llvm::Twine::Twine(&local_910,"");
  llvm::Twine::Twine(&local_928,"");
  llvm::Twine::Twine((Twine *)(linkPath.super_SmallVector<char,_256U>.
                               super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),"");
  pTVar8 = &local_8f8;
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_8b0,pTVar8,&local_910,&local_928,
             (Twine *)(linkPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                       InlineElts + 0xf8));
  _Var7 = (__mode_t)pTVar8;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_8b0);
  llbuild::basic::sys::mkdir(pcVar4,_Var7);
  local_a60 = llvm::SmallString<256U>::str((SmallString<256U> *)local_8b0);
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_a50,local_a60);
  llvm::Twine::Twine(&local_a78,"link.txt");
  llvm::Twine::Twine(&local_a90,"");
  llvm::Twine::Twine(&local_aa8,"");
  llvm::Twine::Twine((Twine *)local_ac0,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_a50,&local_a78,&local_a90,&local_aa8,(Twine *)local_ac0)
  ;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_280);
  pcVar5 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_a50);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = llbuild::basic::sys::symlink(pcVar4,pcVar5);
  local_adc = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_ad8,"res","0",
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4),&local_adc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar1) {
    testing::Message::Message(&local_ae8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ad8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               (directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>
                .InlineElts + 0xf8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               (directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>
                .InlineElts + 0xf8),&local_ae8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               (directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>
                .InlineElts + 0xf8));
    testing::Message::~Message(&local_ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  local_c10 = llvm::SmallString<256U>::str((SmallString<256U> *)local_8b0);
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_c00,local_c10);
  llvm::Twine::Twine(&local_c28,"link_to_other_dir");
  llvm::Twine::Twine(&local_c40,"");
  llvm::Twine::Twine(&local_c58,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_1.message_,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_c00,&local_c28,&local_c40,&local_c58,
             (Twine *)&gtest_ar_1.message_);
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_4d8);
  pcVar5 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_c00);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = llbuild::basic::sys::symlink(pcVar4,pcVar5);
  local_c84 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c80,"res","0",
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4),&local_c84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
  if (!bVar1) {
    testing::Message::Message(&local_c90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fs,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x8e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fs,&local_c90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fs);
    testing::Message::~Message(&local_c90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
  llbuild::basic::createLocalFileSystem();
  pFVar6 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                         *)&stack0xfffffffffffff360);
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_cc8,pcVar4,
             (allocator *)
             ((long)&gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  iVar2 = (*pFVar6->_vptr_FileSystem[5])(pFVar6,local_cc8);
  std::__cxx11::string::~string(local_cc8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  local_ca1 = (bool)((byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ce0,&local_ca1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce0);
  if (!bVar1) {
    testing::Message::Message(&local_ce8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(statbuf.__glibc_reserved + 2),(internal *)local_ce0,
               (AssertionResult *)0x291ef6,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=(&local_cf0,&local_ce8);
    testing::internal::AssertHelper::~AssertHelper(&local_cf0);
    std::__cxx11::string::~string((string *)(statbuf.__glibc_reserved + 2));
    testing::Message::~Message(&local_ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce0);
  local_db8[1] = 0xffffffff;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_8b0);
  local_db8[0] = llbuild::basic::sys::stat(pcVar4,(stat *)&gtest_ar_2.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_db0,"-1","sys::stat(tempDir.c_str(), &statbuf)",local_db8 + 1,
             local_db8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db0);
  if (!bVar1) {
    testing::Message::Message(&local_dc0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_db0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x95,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_dc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db0);
  local_ddc = 2;
  rhs = __errno_location();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_dd8,"2","(*__errno_location ())",&local_ddc,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
  if (!bVar1) {
    testing::Message::Message(&local_de8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_dd8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x96,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_de8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
  local_e08[1] = 0;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_280);
  local_e08[0] = llbuild::basic::sys::stat(pcVar4,(stat *)&gtest_ar_2.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e00,"0","sys::stat(file.c_str(), &statbuf)",local_e08 + 1,local_e08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
  if (!bVar1) {
    testing::Message::Message(&local_e10);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x98,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
  local_e30[1] = 0;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_678);
  local_e30[0] = llbuild::basic::sys::stat(pcVar4,(stat *)&gtest_ar_2.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e28,"0","sys::stat(otherFile.c_str(), &statbuf)",local_e30 + 1,
             local_e30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e28);
  if (!bVar1) {
    testing::Message::Message(&local_e38);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e28);
    testing::internal::AssertHelper::AssertHelper
              (&local_e40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x9a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e40,&local_e38);
    testing::internal::AssertHelper::~AssertHelper(&local_e40);
    testing::Message::~Message(&local_e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e28);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
               *)&stack0xfffffffffffff360);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_c00);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_a50);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_8b0);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_678);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_4d8);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_280);
  llbuild::TmpDir::~TmpDir((TmpDir *)local_160);
  return;
}

Assistant:

TEST(FileSystemTest, testRecursiveRemovalDoesNotFollowSymlinks) {
  TmpDir rootTempDir(__func__);

  SmallString<256> file{ rootTempDir.str() };
  llvm::sys::path::append(file, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(file.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> otherDir{ rootTempDir.str() };
  llvm::sys::path::append(otherDir, "other_dir");
  sys::mkdir(otherDir.c_str());

  SmallString<256> otherFile{ otherDir.str() };
  llvm::sys::path::append(otherFile, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(otherFile.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> tempDir { rootTempDir.str() };
  llvm::sys::path::append(tempDir, "root");
  sys::mkdir(tempDir.c_str());

  SmallString<256> linkPath { tempDir.str() };
  llvm::sys::path::append(linkPath, "link.txt");
  int res = sys::symlink(file.c_str(), linkPath.c_str());
  EXPECT_EQ(res, 0);

  SmallString<256> directoryLinkPath { tempDir.str() };
  llvm::sys::path::append(directoryLinkPath, "link_to_other_dir");
  res = sys::symlink(otherDir.c_str(), directoryLinkPath.c_str());
  EXPECT_EQ(res, 0);

  auto fs = createLocalFileSystem();
  bool result = fs->remove(tempDir.c_str());
  EXPECT_TRUE(result);

  sys::StatStruct  statbuf;
  EXPECT_EQ(-1, sys::stat(tempDir.c_str(), &statbuf));
  EXPECT_EQ(ENOENT, errno);
  // Verify that the symlink target still exists.
  EXPECT_EQ(0, sys::stat(file.c_str(), &statbuf));
  // Verify that we did not delete the symlinked directories contents.
  EXPECT_EQ(0, sys::stat(otherFile.c_str(), &statbuf));
}